

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdUnop<unsigned_char,unsigned_char>
          (Thread *this,UnopFunc<unsigned_char,_unsigned_char> *f)

{
  Simd<unsigned_char,_(unsigned_char)__x10_> value;
  uchar *__first;
  uchar *__last;
  uchar *__result;
  uchar local_38 [8];
  SR result;
  Simd<unsigned_char,_(unsigned_char)__x10_> val;
  UnopFunc<unsigned_char,_unsigned_char> *f_local;
  Thread *this_local;
  
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this);
  __first = std::begin<unsigned_char,16ul>((uchar (*) [16])(result.v + 8));
  __last = std::end<unsigned_char,16ul>((uchar (*) [16])(result.v + 8));
  __result = std::begin<unsigned_char,16ul>((uchar (*) [16])local_38);
  std::transform<unsigned_char*,unsigned_char*,unsigned_char(*)(unsigned_char)>
            (__first,__last,__result,f);
  value.v[8] = result.v[0];
  value.v[9] = result.v[1];
  value.v[10] = result.v[2];
  value.v[0xb] = result.v[3];
  value.v[0xc] = result.v[4];
  value.v[0xd] = result.v[5];
  value.v[0xe] = result.v[6];
  value.v[0xf] = result.v[7];
  value.v[0] = local_38[0];
  value.v[1] = local_38[1];
  value.v[2] = local_38[2];
  value.v[3] = local_38[3];
  value.v[4] = local_38[4];
  value.v[5] = local_38[5];
  value.v[6] = local_38[6];
  value.v[7] = local_38[7];
  Push<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdUnop(UnopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  auto val = Pop<ST>();
  SR result;
  std::transform(std::begin(val.v), std::end(val.v), std::begin(result.v), f);
  Push(result);
  return RunResult::Ok;
}